

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void la_global_sync(TCGContext_conflict9 *s,int ng)

{
  uint uVar1;
  int local_18;
  int state;
  int i;
  int ng_local;
  TCGContext_conflict9 *s_local;
  
  for (local_18 = 0; local_18 < ng; local_18 = local_18 + 1) {
    uVar1 = (uint)s->temps[local_18].state;
    s->temps[local_18].state = (long)(int)(uVar1 | 2);
    if (uVar1 == 1) {
      la_reset_pref(s,s->temps + local_18);
    }
  }
  return;
}

Assistant:

static void la_global_sync(TCGContext *s, int ng)
{
    int i;

    for (i = 0; i < ng; ++i) {
        int state = s->temps[i].state;
        s->temps[i].state = state | TS_MEM;
        if (state == TS_DEAD) {
            /* If the global was previously dead, reset prefs.  */
            la_reset_pref(s, &s->temps[i]);
        }
    }
}